

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O0

int mk_rconf_read(mk_rconf *conf,char *path)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  ushort **ppuVar7;
  undefined8 *puVar8;
  bool bVar9;
  int end;
  FILE *f;
  mk_rconf_section *current;
  mk_rconf_file *file;
  stat st;
  char *cfg_file;
  char *val;
  char *key;
  char *indent;
  char *section;
  char tmp [4096];
  char *buf;
  int n_keys;
  int indent_len;
  int line;
  int ret;
  int len;
  int i;
  char *path_local;
  mk_rconf *conf_local;
  
  n_keys = 0;
  buf._4_4_ = -1;
  buf._0_4_ = 0;
  indent = (char *)0x0;
  key = (char *)0x0;
  f = (FILE *)0x0;
  st.__glibc_reserved[2] = (__syscall_slong_t)path;
  if (((-1 < conf->level) && (iVar1 = stat(path,(stat *)&file), iVar1 == -1)) &&
     (piVar3 = __errno_location(), *piVar3 == 2)) {
    if (*path == '/') {
      return -1;
    }
    if (conf->root_path != (char *)0x0) {
      snprintf((char *)&section,0x1000,"%s/%s",conf->root_path,path);
      st.__glibc_reserved[2] = (__syscall_slong_t)&section;
    }
  }
  iVar1 = is_file_included(conf,(char *)st.__glibc_reserved[2]);
  if (iVar1 == 1) {
    mk_print(0x1001,"[config] file already included %s",st.__glibc_reserved[2]);
  }
  else {
    conf->level = conf->level + 1;
    __stream = fopen((char *)st.__glibc_reserved[2],"r");
    if (__stream == (FILE *)0x0) {
      mk_print(0x1002,"[config] I cannot open %s file",st.__glibc_reserved[2]);
    }
    else {
      pcVar4 = (char *)mk_mem_alloc(0x1000);
      if (pcVar4 == (char *)0x0) {
        fclose(__stream);
        perror("malloc");
      }
      else {
LAB_00119eb6:
        do {
          while( true ) {
            do {
              pcVar5 = fgets(pcVar4,0x1000,__stream);
              if (pcVar5 == (char *)0x0) {
                fclose(__stream);
                if (key != (char *)0x0) {
                  mk_mem_free(key);
                }
                mk_mem_free(pcVar4);
                puVar8 = (undefined8 *)mk_mem_alloc(0x18);
                if (puVar8 == (undefined8 *)0x0) {
                  conf->level = conf->level + -1;
                  return -1;
                }
                pcVar4 = mk_string_dup(path);
                *puVar8 = pcVar4;
                mk_list_add((mk_list *)(puVar8 + 1),&conf->includes);
                conf->level = conf->level + -1;
                return 0;
              }
              sVar6 = strlen(pcVar4);
              iVar1 = (int)sVar6;
              if ((iVar1 < 1) || (pcVar4[iVar1 + -1] != '\n')) {
                iVar2 = feof(__stream);
                line = iVar1;
                if (iVar2 == 0) {
                  mk_config_error(path,n_keys,"Length of content has exceeded limit");
                  fclose(__stream);
                  mk_mem_free(pcVar4);
                  return -1;
                }
              }
              else {
                line = iVar1 + -1;
                pcVar4[line] = '\0';
                if ((line != 0) && (pcVar4[iVar1 + -2] == '\r')) {
                  line = iVar1 + -2;
                  pcVar4[line] = '\0';
                }
              }
              n_keys = n_keys + 1;
            } while ((*pcVar4 == '\0') || (*pcVar4 == '#'));
            if ((line < 10) || (iVar1 = strncasecmp(pcVar4,"@INCLUDE ",9), iVar1 != 0)) break;
            pcVar5 = strchr(pcVar4 + 9,0x2a);
            if (pcVar5 == (char *)0x0) {
              indent_len = mk_rconf_read(conf,pcVar4 + 9);
            }
            else {
              indent_len = mk_rconf_read_glob(conf,pcVar4 + 9);
            }
            if (indent_len == -1) {
              conf->level = conf->level + -1;
              fclose(__stream);
              if (key != (char *)0x0) {
                mk_mem_free(key);
              }
              mk_mem_free(pcVar4);
              return -1;
            }
          }
          if ((*pcVar4 != '@') || (line < 4)) {
            if (*pcVar4 == '[') {
              iVar1 = mk_string_char_search(pcVar4,0x5d,line);
              if (iVar1 < 1) {
                mk_config_error(path,n_keys,"Bad header definition");
                fclose(__stream);
                mk_mem_free(pcVar4);
                return -1;
              }
              if ((f != (FILE *)0x0) && ((int)buf == 0)) {
                mk_rconf_warning(path,n_keys,"Previous section did not have keys");
              }
              indent = mk_string_copy_substr(pcVar4,1,iVar1);
              f = (FILE *)mk_rconf_section_add(conf,indent);
              if (f == (FILE *)0x0) {
                fclose(__stream);
                if (key != (char *)0x0) {
                  mk_mem_free(key);
                }
                mk_mem_free(pcVar4);
                mk_mem_free(indent);
                return -1;
              }
              mk_mem_free(indent);
              buf._0_4_ = 0;
              goto LAB_00119eb6;
            }
            if (key == (char *)0x0) {
              ret = 0;
              do {
                ret = ret + 1;
                bVar9 = false;
                if (ret < line) {
                  ppuVar7 = __ctype_b_loc();
                  bVar9 = ((*ppuVar7)[(int)pcVar4[ret]] & 1) != 0;
                }
              } while (bVar9);
              key = mk_string_copy_substr(pcVar4,0,ret);
              sVar6 = strlen(key);
              buf._4_4_ = (int)sVar6;
              if (ret == line) goto LAB_00119eb6;
            }
            iVar1 = check_indent(pcVar4,key);
            if (iVar1 < 0) {
              mk_config_error(path,n_keys,"Invalid indentation level");
              fclose(__stream);
              return -1;
            }
            if (((pcVar4[buf._4_4_] != '#') && (buf._4_4_ != line)) &&
               ((line - buf._4_4_ < 3 || (iVar1 = strncmp(pcVar4 + buf._4_4_,"---",3), iVar1 != 0)))
               ) {
              iVar1 = mk_string_char_search(pcVar4 + buf._4_4_,0x20,line - buf._4_4_);
              val = mk_string_copy_substr(pcVar4 + buf._4_4_,0,iVar1);
              cfg_file = mk_string_copy_substr
                                   (pcVar4 + (long)iVar1 + (long)buf._4_4_,1,
                                    (line - buf._4_4_) - iVar1);
              if (((val == (char *)0x0) || (cfg_file == (char *)0x0)) || (iVar1 < 0)) {
                mk_config_error(path,n_keys,"Each key must have a value");
                fclose(__stream);
                mk_mem_free(val);
                mk_mem_free(cfg_file);
                return -1;
              }
              mk_string_trim(&val);
              mk_string_trim(&cfg_file);
              sVar6 = strlen(cfg_file);
              if (sVar6 == 0) {
                mk_config_error(path,n_keys,"Key has an empty value");
                fclose(__stream);
                mk_mem_free(val);
                mk_mem_free(cfg_file);
                return -1;
              }
              mk_rconf_section_entry_add(conf,val,cfg_file);
              mk_mem_free(val);
              mk_mem_free(cfg_file);
              buf._0_4_ = (int)buf + 1;
            }
            goto LAB_00119eb6;
          }
          iVar1 = mk_rconf_meta_add(conf,pcVar4,line);
        } while (iVar1 != -1);
        fclose(__stream);
        if (key != (char *)0x0) {
          mk_mem_free(key);
        }
        mk_mem_free(pcVar4);
      }
    }
  }
  return -1;
}

Assistant:

static int mk_rconf_read(struct mk_rconf *conf, const char *path)
{
    int i;
    int len;
    int ret;
    int line = 0;
    int indent_len = -1;
    int n_keys = 0;
    char *buf;
    char tmp[PATH_MAX];
    char *section = NULL;
    char *indent = NULL;
    char *key, *val;
    char *cfg_file = (char *) path;
    struct stat st;
    struct mk_rconf_file *file;
    struct mk_rconf_section *current = NULL;
    FILE *f;

    /* Check if the path exists (relative cases for included files) */
    if (conf->level >= 0) {
        ret = stat(path, &st);
        if (ret == -1 && errno == ENOENT) {
            /* Try to resolve the real path (if exists) */
            if (path[0] == '/') {
                return -1;
            }

            if (conf->root_path) {
                snprintf(tmp, PATH_MAX, "%s/%s", conf->root_path, path);
                cfg_file = tmp;
            }
        }
    }

    /* Check this file have not been included before */
    ret = is_file_included(conf, cfg_file);
    if (ret == MK_TRUE) {
        mk_err("[config] file already included %s", cfg_file);
        return -1;
    }

    conf->level++;

    /* Open configuration file */
    if ((f = fopen(cfg_file, "r")) == NULL) {
        mk_warn("[config] I cannot open %s file", cfg_file);
        return -1;
    }

    /* Allocate temporal buffer to read file content */
    buf = mk_mem_alloc(MK_RCONF_KV_SIZE);
    if (!buf) {
        fclose(f);
        perror("malloc");
        return -1;
    }

    /* looking for configuration directives */
    while (fgets(buf, MK_RCONF_KV_SIZE, f)) {
        len = strlen(buf);
        if (len > 0 && buf[len - 1] == '\n') {
            buf[--len] = 0;
            if (len && buf[len - 1] == '\r') {
                buf[--len] = 0;
            }
        }
        else {
            /*
             * If we don't find a break line, validate if we got an EOF or not. No EOF
             * means that the incoming string is not finished so we must raise an
             * exception.
             */
            if (!feof(f)) {
                mk_config_error(path, line, "Length of content has exceeded limit");
                fclose(f);
                mk_mem_free(buf);
                return -1;
            }
        }

        /* Line number */
        line++;

        if (!buf[0]) {
            continue;
        }

        /* Skip commented lines */
        if (buf[0] == '#') {
            continue;
        }

        if (len > 9 && strncasecmp(buf, "@INCLUDE ", 9) == 0) {
            if (strchr(buf + 9, '*') != NULL) {
                ret = mk_rconf_read_glob(conf, buf + 9);
            }
            else {
                ret = mk_rconf_read(conf, buf + 9);
            }
            if (ret == -1) {
                conf->level--;
                fclose(f);
                if (indent) {
                    mk_mem_free(indent);
                }
                mk_mem_free(buf);
                return -1;
            }
            continue;
        }
        else if (buf[0] == '@' && len > 3) {
            ret = mk_rconf_meta_add(conf, buf, len);
            if (ret == -1) {
                fclose(f);
                if (indent) {
                    mk_mem_free(indent);
                }
                mk_mem_free(buf);
                return -1;
            }
            continue;
        }

        /* Section definition */
        if (buf[0] == '[') {
            int end = -1;
            end = mk_string_char_search(buf, ']', len);
            if (end > 0) {
                /*
                 * Before to add a new section, lets check the previous
                 * one have at least one key set
                 */
                if (current && n_keys == 0) {
                    mk_rconf_warning(path, line, "Previous section did not have keys");
                }

                /* Create new section */
                section = mk_string_copy_substr(buf, 1, end);
                current = mk_rconf_section_add(conf, section);
                if (!current) {
                    fclose(f);
                    if (indent) {
                        mk_mem_free(indent);
                    }
                    mk_mem_free(buf);
                    mk_mem_free(section);
                    return -1;
                }
                mk_mem_free(section);
                n_keys = 0;
                continue;
            }
            else {
                mk_config_error(path, line, "Bad header definition");
                fclose(f);
                mk_mem_free(buf);
                return -1;
            }
        }

        /* No separator defined */
        if (!indent) {
            i = 0;

            do { i++; } while (i < len && isblank(buf[i]));

            indent = mk_string_copy_substr(buf, 0, i);
            indent_len = strlen(indent);

            /* Blank indented line */
            if (i == len) {
                continue;
            }
        }

        /* Validate indentation level */
        if (check_indent(buf, indent) < 0) {
            mk_config_error(path, line, "Invalid indentation level");
            fclose(f);
            return -1;
        }

        if (buf[indent_len] == '#' || indent_len == len) {
            continue;
        }

        if (len - indent_len >= 3 && strncmp(buf + indent_len, "---", 3) == 0) {
            continue;
        }

        /* Get key and val */
        i = mk_string_char_search(buf + indent_len, ' ', len - indent_len);
        key = mk_string_copy_substr(buf + indent_len, 0, i);
        val = mk_string_copy_substr(buf + indent_len + i, 1, len - indent_len - i);

        if (!key || !val || i < 0) {
            mk_config_error(path, line, "Each key must have a value");
            fclose(f);
            mk_mem_free(key);
            mk_mem_free(val);
            return -1;
        }

        /* Trim strings */
        mk_string_trim(&key);
        mk_string_trim(&val);

        if (strlen(val) == 0) {
            mk_config_error(path, line, "Key has an empty value");
            fclose(f);
            mk_mem_free(key);
            mk_mem_free(val);
            return -1;
        }

        /* Register entry: key and val are copied as duplicated */
        mk_rconf_section_entry_add(conf, key, val);

        /* Free temporal key and val */
        mk_mem_free(key);
        mk_mem_free(val);

        n_keys++;
    }

    if (section && n_keys == 0) {
        /* No key, no warning */
    }

    /*
    struct mk_config_section *s;
    struct mk_rconf_entry *e;

    s = conf->section;
    while(s) {
        printf("\n[%s]", s->name);
        e = s->entry;
        while(e) {
            printf("\n   %s = %s", e->key, e->val);
            e = e->next;
        }
        s = s->next;
    }
    fflush(stdout);
    */
    fclose(f);
    if (indent) {
        mk_mem_free(indent);
    }
    mk_mem_free(buf);

    /* Append this file to the list */
    file = mk_mem_alloc(sizeof(struct mk_rconf_file));
    if (!file) {
        conf->level--;
        return -1;
    }

    file->path = mk_string_dup(path);
    mk_list_add(&file->_head, &conf->includes);
    conf->level--;
    return 0;
}